

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::RegisterUniquePropertyGuard
          (ThreadContext *this,PropertyId propertyId,
          RecyclerWeakReference<Js::PropertyGuard> *guardWeakRef)

{
  code *pcVar1;
  PropertyRecord *pPVar2;
  bool bVar3;
  undefined4 *puVar4;
  PropertyGuardEntry *pPVar5;
  intptr_t *piVar6;
  char16 *pcVar7;
  intptr_t iVar8;
  char16_t *pcVar9;
  PropertyGuardEntry *entry;
  PropertyRecord *pPStack_30;
  bool foundExistingGuard;
  PropertyRecord *propertyRecord;
  PropertyGuard *guard;
  RecyclerWeakReference<Js::PropertyGuard> *guardWeakRef_local;
  ThreadContext *pTStack_10;
  PropertyId propertyId_local;
  ThreadContext *this_local;
  
  guard = (PropertyGuard *)guardWeakRef;
  guardWeakRef_local._4_4_ = propertyId;
  pTStack_10 = this;
  bVar3 = IsActivePropertyId(this,propertyId);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xde6,"(IsActivePropertyId(propertyId))","IsActivePropertyId(propertyId)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (guard == (PropertyGuard *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xde7,"(guardWeakRef != nullptr)","guardWeakRef != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  propertyRecord =
       (PropertyRecord *)
       Memory::RecyclerWeakReference<Js::PropertyGuard>::Get
                 ((RecyclerWeakReference<Js::PropertyGuard> *)guard);
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xdea,"(guard != nullptr)","guard != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPStack_30 = GetPropertyName(this,guardWeakRef_local._4_4_);
  pPVar5 = EnsurePropertyGuardEntry(this,pPStack_30,(bool *)((long)&entry + 7));
  JsUtil::
  BaseHashSet<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Item(&pPVar5->uniqueGuards,(RecyclerWeakReference<Js::PropertyGuard> **)&guard);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TracePropertyGuardsPhase);
  if ((bVar3) ||
     ((bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FixedMethodsPhase), bVar3 &&
      ((DAT_01ec73ca & 1) != 0)))) {
    pcVar7 = Js::PropertyRecord::GetBuffer(pPStack_30);
    pPVar2 = propertyRecord;
    iVar8 = Js::PropertyGuard::GetValue((PropertyGuard *)propertyRecord);
    piVar6 = Js::PropertyGuard::GetAddressOfValue((PropertyGuard *)propertyRecord);
    pcVar9 = L"new";
    if ((entry._7_1_ & 1) != 0) {
      pcVar9 = L"existing";
    }
    Output::Print(L"FixedFields: registered unique guard: name: %s, address: 0x%p, value: 0x%p, value address: 0x%p, %s entry\n"
                  ,pcVar7,pPVar2,iVar8,piVar6,pcVar9);
    Output::Flush();
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,TracePropertyGuardsPhase);
  if ((bVar3) ||
     ((bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixedMethodsPhase), bVar3 &&
      ((DAT_01ec73ca & 1) != 0)))) {
    pcVar7 = Js::PropertyRecord::GetBuffer(pPStack_30);
    iVar8 = Js::PropertyGuard::GetValue((PropertyGuard *)propertyRecord);
    pcVar9 = L"new";
    if ((entry._7_1_ & 1) != 0) {
      pcVar9 = L"existing";
    }
    Output::Print(L"FixedFields: registered unique guard: name: %s, value: 0x%p, %s entry\n",pcVar7,
                  iVar8,pcVar9);
    Output::Flush();
  }
  return;
}

Assistant:

void
ThreadContext::RegisterUniquePropertyGuard(Js::PropertyId propertyId, RecyclerWeakReference<Js::PropertyGuard>* guardWeakRef)
{
    Assert(IsActivePropertyId(propertyId));
    Assert(guardWeakRef != nullptr);

    Js::PropertyGuard* guard = guardWeakRef->Get();
    Assert(guard != nullptr);

    const Js::PropertyRecord * propertyRecord = GetPropertyName(propertyId);

    bool foundExistingGuard;


    PropertyGuardEntry* entry = EnsurePropertyGuardEntry(propertyRecord, foundExistingGuard);

    entry->uniqueGuards.Item(guardWeakRef);

    if (PHASE_TRACE1(Js::TracePropertyGuardsPhase) || PHASE_VERBOSE_TRACE1(Js::FixedMethodsPhase))
    {
        Output::Print(_u("FixedFields: registered unique guard: name: %s, address: 0x%p, value: 0x%p, value address: 0x%p, %s entry\n"),
            propertyRecord->GetBuffer(), guard, guard->GetValue(), guard->GetAddressOfValue(), foundExistingGuard ? _u("existing") : _u("new"));
        Output::Flush();
    }

    if (PHASE_TESTTRACE1(Js::TracePropertyGuardsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::FixedMethodsPhase))
    {
        Output::Print(_u("FixedFields: registered unique guard: name: %s, value: 0x%p, %s entry\n"),
            propertyRecord->GetBuffer(), guard->GetValue(), foundExistingGuard ? _u("existing") : _u("new"));
        Output::Flush();
    }
}